

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  secp256k1_scalar *r_00;
  secp256k1_gej *a_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint flag;
  ulong uVar6;
  uchar *a_01;
  uint uVar7;
  secp256k1_fe *psVar8;
  long lVar9;
  secp256k1_gej *psVar10;
  secp256k1_ge *psVar11;
  ulong uVar12;
  secp256k1_fe *buf;
  secp256k1_gej *a_02;
  ulong uVar13;
  undefined1 *puVar14;
  secp256k1_fe *psVar15;
  ulong uVar16;
  secp256k1_gej *psVar17;
  ulong uVar18;
  uint negative;
  secp256k1_ge t;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_fe global_z;
  secp256k1_scalar s;
  secp256k1_ge pre_a_lam [16];
  secp256k1_ge pre_a [16];
  secp256k1_fe sStack_f78;
  secp256k1_ge sStack_f48;
  undefined1 *puStack_ee0;
  secp256k1_fe *psStack_ed8;
  secp256k1_gej *psStack_ed0;
  secp256k1_gej *psStack_ec0;
  code *pcStack_eb8;
  secp256k1_fe *psStack_eb0;
  secp256k1_ge *psStack_ea8;
  secp256k1_gej *psStack_ea0;
  uint local_e94;
  secp256k1_gej *local_e90;
  secp256k1_ge *local_e88;
  secp256k1_ge *local_e80;
  secp256k1_fe *local_e78;
  secp256k1_gej *local_e70;
  secp256k1_fe local_e68;
  undefined1 local_e38 [56];
  uint64_t uStack_e00;
  uint64_t local_df8;
  uint64_t uStack_df0;
  uint64_t local_de8;
  int iStack_de0;
  int iStack_ddc;
  int local_dd8;
  undefined1 local_dc8 [32];
  undefined1 local_da8 [112];
  secp256k1_ge local_d38 [16];
  secp256k1_ge local_6b8 [16];
  
  psStack_ea0 = (secp256k1_gej *)0x122e60;
  secp256k1_ge_verify(a);
  if (a->infinity != 0) {
    secp256k1_gej_set_infinity(r);
    return;
  }
  r_00 = (secp256k1_scalar *)(local_da8 + 0x50);
  psStack_ea0 = (secp256k1_gej *)0x122e9a;
  secp256k1_scalar_add(r_00,q,&secp256k1_ecmult_const_K);
  psStack_ea0 = (secp256k1_gej *)0x122ea5;
  secp256k1_scalar_half(r_00,r_00);
  psVar17 = (secp256k1_gej *)local_da8;
  psStack_ea0 = (secp256k1_gej *)0x122ec3;
  secp256k1_scalar_split_lambda((secp256k1_scalar *)psVar17,(secp256k1_scalar *)local_dc8,r_00);
  psStack_ea0 = (secp256k1_gej *)0x122ed8;
  secp256k1_scalar_add
            ((secp256k1_scalar *)psVar17,(secp256k1_scalar *)psVar17,
             &secp256k1_ecmult_const::S_OFFSET);
  psStack_ea0 = (secp256k1_gej *)0x122ee6;
  secp256k1_scalar_add
            ((secp256k1_scalar *)local_dc8,(secp256k1_scalar *)local_dc8,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar8 = (secp256k1_fe *)0x81;
  local_e90 = r;
  do {
    psVar10 = local_e90;
    psStack_ea0 = (secp256k1_gej *)0x122ef8;
    a_02 = psVar17;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar17);
    if ((*(ulong *)(local_da8 + ((ulong)psVar8 >> 6) * 8) >> ((ulong)psVar8 & 0x3f) & 1) != 0) {
      psStack_ea0 = (secp256k1_gej *)0x12330b;
      secp256k1_ecmult_const_cold_1();
LAB_0012330b:
      psStack_ea0 = (secp256k1_gej *)0x123310;
      secp256k1_ecmult_const_cold_2();
      goto LAB_00123310;
    }
    psVar10 = (secp256k1_gej *)(ulong)((uint)psVar8 & 0x3f);
    psStack_ea0 = (secp256k1_gej *)0x122f1e;
    a_02 = (secp256k1_gej *)local_dc8;
    secp256k1_scalar_verify((secp256k1_scalar *)local_dc8);
    a_00 = local_e90;
    if ((*(ulong *)(local_dc8 + ((ulong)psVar8 >> 6) * 8) >> (long)psVar10 & 1) != 0)
    goto LAB_0012330b;
    uVar7 = (uint)psVar8 + 1;
    psVar8 = (secp256k1_fe *)(ulong)uVar7;
  } while (uVar7 != 0x100);
  psStack_ea0 = (secp256k1_gej *)0x122f4a;
  secp256k1_gej_set_ge(local_e90,a);
  psStack_ea0 = (secp256k1_gej *)0x122f75;
  secp256k1_ecmult_odd_multiples_table
            (0x10,local_6b8,&local_d38[0].x,(secp256k1_fe *)(local_da8 + 0x20),a_00);
  psStack_ea0 = (secp256k1_gej *)0x122f8f;
  local_e88 = local_d38;
  local_e80 = local_6b8;
  secp256k1_ge_table_set_globalz(0x10,local_6b8,&local_d38[0].x);
  lVar9 = 0;
  do {
    psStack_ea0 = (secp256k1_gej *)0x122fac;
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)local_d38[0].x.n + lVar9),
               (secp256k1_ge *)((long)local_6b8[0].x.n + lVar9));
    lVar9 = lVar9 + 0x68;
  } while (lVar9 != 0x680);
  a = (secp256k1_ge *)(local_e38 + 0x30);
  local_e80 = (secp256k1_ge *)&local_e80[1].y;
  local_e88 = (secp256k1_ge *)(&local_e88[1].x + 1);
  psVar8 = (secp256k1_fe *)0x19;
  while( true ) {
    uVar7 = (int)psVar8 * 5;
    psVar10 = (secp256k1_gej *)(ulong)uVar7;
    psStack_ea0 = (secp256k1_gej *)0x122ff1;
    uVar1 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)local_da8,uVar7,5);
    psVar17 = (secp256k1_gej *)(ulong)uVar1;
    a_02 = (secp256k1_gej *)local_dc8;
    psStack_ea0 = (secp256k1_gej *)0x123008;
    uVar2 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_02,uVar7,5);
    local_e94 = uVar1 >> 4 ^ 1;
    if (0x1f < uVar1) break;
    psVar10 = (secp256k1_gej *)(ulong)((uVar1 ^ -local_e94) & 0xf);
    local_e38._32_8_ = local_6b8[0].x.n[4];
    local_e38._40_4_ = local_6b8[0].x.magnitude;
    local_e38._44_4_ = local_6b8[0].x.normalized;
    local_e38._16_8_ = local_6b8[0].x.n[2];
    local_e38._24_8_ = local_6b8[0].x.n[3];
    local_e38._0_8_ = local_6b8[0].x.n[0];
    local_e38._8_8_ = local_6b8[0].x.n[1];
    local_de8 = local_6b8[0].y.n[4];
    iStack_de0 = local_6b8[0].y.magnitude;
    iStack_ddc = local_6b8[0].y.normalized;
    local_df8 = local_6b8[0].y.n[2];
    uStack_df0 = local_6b8[0].y.n[3];
    local_e38._48_8_ = local_6b8[0].y.n[0];
    uStack_e00 = local_6b8[0].y.n[1];
    psVar17 = (secp256k1_gej *)0x1;
    psVar11 = local_e80;
    local_e78 = psVar8;
    local_e70 = (secp256k1_gej *)CONCAT44(extraout_var,uVar2);
    do {
      psStack_ea0 = (secp256k1_gej *)0x1230a4;
      uVar7 = (uint)(psVar10 == psVar17);
      secp256k1_fe_cmov((secp256k1_fe *)local_e38,(secp256k1_fe *)((long)psVar11 + -0x30),uVar7);
      psStack_ea0 = (secp256k1_gej *)0x1230b1;
      secp256k1_fe_cmov((secp256k1_fe *)a,&psVar11->x,uVar7);
      psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1);
      psVar11 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar11 + 0x60))->n + 1);
    } while (psVar17 != (secp256k1_gej *)0x10);
    local_dd8 = 0;
    psStack_ea0 = (secp256k1_gej *)0x1230d1;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_ea0 = (secp256k1_gej *)0x1230de;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_e68.n[0] = 0x3ffffbfffff0bc - local_e38._48_8_;
    local_e68.n[1] = 0x3ffffffffffffc - uStack_e00;
    local_e68.n[2] = 0x3ffffffffffffc - local_df8;
    local_e68.n[3] = 0x3ffffffffffffc - uStack_df0;
    local_e68.n[4] = 0x3fffffffffffc - local_de8;
    local_e68.magnitude = 2;
    local_e68.normalized = 0;
    psVar8 = &local_e68;
    psStack_ea0 = (secp256k1_gej *)0x123139;
    secp256k1_fe_verify(psVar8);
    psStack_ea0 = (secp256k1_gej *)0x123148;
    secp256k1_fe_cmov((secp256k1_fe *)a,psVar8,local_e94);
    psVar17 = local_e90;
    if ((int)local_e78 == 0x19) {
      psStack_ea0 = (secp256k1_gej *)0x12315c;
      a_02 = local_e90;
      secp256k1_gej_set_ge(local_e90,(secp256k1_ge *)local_e38);
      psVar17 = psVar10;
    }
    else {
      psVar8 = (secp256k1_fe *)0x5;
      do {
        psStack_ea0 = (secp256k1_gej *)0x123173;
        secp256k1_gej_double(psVar17,psVar17);
        uVar7 = (int)psVar8 - 1;
        psVar8 = (secp256k1_fe *)(ulong)uVar7;
      } while (uVar7 != 0);
      psStack_ea0 = (secp256k1_gej *)0x123185;
      a_02 = psVar17;
      secp256k1_gej_add_ge(psVar17,psVar17,(secp256k1_ge *)local_e38);
    }
    uVar7 = (uint)local_e70;
    local_e94 = (uint)((ulong)local_e70 >> 4) & 0xfffffff ^ 1;
    psVar10 = local_e70;
    if (0x1f < uVar7) goto LAB_00123315;
    uVar3 = -local_e94;
    local_e38._32_8_ = local_d38[0].x.n[4];
    local_e38._40_4_ = local_d38[0].x.magnitude;
    local_e38._44_4_ = local_d38[0].x.normalized;
    local_e38._16_8_ = local_d38[0].x.n[2];
    local_e38._24_8_ = local_d38[0].x.n[3];
    local_e38._0_8_ = local_d38[0].x.n[0];
    local_e38._8_8_ = local_d38[0].x.n[1];
    local_de8 = local_d38[0].y.n[4];
    iStack_de0 = local_d38[0].y.magnitude;
    iStack_ddc = local_d38[0].y.normalized;
    local_df8 = local_d38[0].y.n[2];
    uStack_df0 = local_d38[0].y.n[3];
    local_e38._48_8_ = local_d38[0].y.n[0];
    uStack_e00 = local_d38[0].y.n[1];
    uVar18 = 1;
    psVar11 = local_e88;
    do {
      psStack_ea0 = (secp256k1_gej *)0x123218;
      flag = (uint)(((uVar7 ^ uVar3) & 0xf) == uVar18);
      secp256k1_fe_cmov((secp256k1_fe *)local_e38,(secp256k1_fe *)((long)psVar11 + -0x30),flag);
      psStack_ea0 = (secp256k1_gej *)0x123225;
      secp256k1_fe_cmov((secp256k1_fe *)a,&psVar11->x,flag);
      uVar18 = uVar18 + 1;
      psVar11 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar11 + 0x60))->n + 1);
    } while (uVar18 != 0x10);
    local_dd8 = 0;
    psStack_ea0 = (secp256k1_gej *)0x123245;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_ea0 = (secp256k1_gej *)0x123252;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_e68.n[0] = 0x3ffffbfffff0bc - local_e38._48_8_;
    local_e68.n[1] = 0x3ffffffffffffc - uStack_e00;
    local_e68.n[2] = 0x3ffffffffffffc - local_df8;
    local_e68.n[3] = 0x3ffffffffffffc - uStack_df0;
    local_e68.n[4] = 0x3fffffffffffc - local_de8;
    local_e68.magnitude = 2;
    local_e68.normalized = 0;
    psStack_ea0 = (secp256k1_gej *)0x1232ad;
    secp256k1_fe_verify(&local_e68);
    psStack_ea0 = (secp256k1_gej *)0x1232bc;
    secp256k1_fe_cmov((secp256k1_fe *)a,&local_e68,local_e94);
    psVar17 = local_e90;
    psStack_ea0 = (secp256k1_gej *)0x1232cf;
    secp256k1_gej_add_ge(local_e90,local_e90,(secp256k1_ge *)local_e38);
    psVar8 = (secp256k1_fe *)(ulong)((int)local_e78 - 1);
    if ((int)local_e78 == 0) {
      psStack_ea0 = (secp256k1_gej *)0x1232f4;
      secp256k1_fe_mul(&psVar17->z,&psVar17->z,(secp256k1_fe *)(local_da8 + 0x20));
      return;
    }
  }
LAB_00123310:
  psStack_ea0 = (secp256k1_gej *)0x123315;
  secp256k1_ecmult_const_cold_4();
LAB_00123315:
  psStack_ea0 = (secp256k1_gej *)secp256k1_fe_normalize;
  secp256k1_ecmult_const_cold_3();
  pcStack_eb8 = (code *)0x12333b;
  psStack_eb0 = psVar8;
  psStack_ea8 = a;
  psStack_ea0 = psVar17;
  secp256k1_fe_verify(&a_02->x);
  uVar18 = (a_02->x).n[4];
  uVar6 = (uVar18 >> 0x30) * 0x1000003d1 + (a_02->x).n[0];
  uVar12 = (uVar6 >> 0x34) + (a_02->x).n[1];
  uVar5 = (uVar12 >> 0x34) + (a_02->x).n[2];
  uVar13 = uVar5 & 0xfffffffffffff;
  uVar5 = (uVar5 >> 0x34) + (a_02->x).n[3];
  uVar18 = (uVar5 >> 0x34) + (uVar18 & 0xffffffffffff);
  uVar6 = uVar6 & 0xfffffffffffff;
  uVar16 = (ulong)(0xffffefffffc2e < uVar6 &&
                  ((uVar13 & uVar12 & uVar5) == 0xfffffffffffff && uVar18 == 0xffffffffffff)) |
           uVar18 >> 0x30;
  uVar6 = uVar16 * 0x1000003d1 + uVar6;
  uVar12 = (uVar6 >> 0x34) + (uVar12 & 0xfffffffffffff);
  psVar8 = (secp256k1_fe *)((uVar12 >> 0x34) + uVar13);
  puVar14 = (undefined1 *)(((ulong)psVar8 >> 0x34) + (uVar5 & 0xfffffffffffff));
  uVar18 = ((ulong)puVar14 >> 0x34) + uVar18;
  if ((uint)(ushort)(uVar18 >> 0x30) == (uint)uVar16) {
    (a_02->x).n[0] = uVar6 & 0xfffffffffffff;
    (a_02->x).n[1] = uVar12 & 0xfffffffffffff;
    (a_02->x).n[2] = (ulong)psVar8 & 0xfffffffffffff;
    (a_02->x).n[3] = (ulong)puVar14 & 0xfffffffffffff;
    (a_02->x).n[4] = uVar18 & 0xffffffffffff;
    (a_02->x).magnitude = 1;
    (a_02->x).normalized = 1;
    secp256k1_fe_verify(&a_02->x);
    return;
  }
  pcStack_eb8 = secp256k1_fe_get_b32;
  secp256k1_fe_normalize_cold_1();
  pcStack_eb8 = (code *)0xffffffffffff;
  psStack_ed0 = (secp256k1_gej *)0x12345b;
  buf = psVar8;
  psVar15 = psVar8;
  psStack_ec0 = a_02;
  secp256k1_fe_verify(psVar8);
  if (psVar8->normalized != 0) {
    *puVar14 = *(undefined1 *)((long)psVar8->n + 0x25);
    puVar14[1] = *(undefined1 *)((long)psVar8->n + 0x24);
    puVar14[2] = *(undefined1 *)((long)psVar8->n + 0x23);
    puVar14[3] = *(undefined1 *)((long)psVar8->n + 0x22);
    puVar14[4] = *(undefined1 *)((long)psVar8->n + 0x21);
    puVar14[5] = (char)psVar8->n[4];
    puVar14[6] = (char)(psVar8->n[3] >> 0x2c);
    puVar14[7] = (char)(psVar8->n[3] >> 0x24);
    puVar14[8] = (char)(psVar8->n[3] >> 0x1c);
    puVar14[9] = (char)((uint)psVar8->n[3] >> 0x14);
    puVar14[10] = (char)((uint)psVar8->n[3] >> 0xc);
    puVar14[0xb] = (char)((uint)psVar8->n[3] >> 4);
    puVar14[0xc] = (byte)((int)psVar8->n[3] << 4) |
                   (byte)*(undefined2 *)((long)psVar8->n + 0x16) & 0xf;
    puVar14[0xd] = *(undefined1 *)((long)psVar8->n + 0x15);
    puVar14[0xe] = *(undefined1 *)((long)psVar8->n + 0x14);
    puVar14[0xf] = *(undefined1 *)((long)psVar8->n + 0x13);
    puVar14[0x10] = *(undefined1 *)((long)psVar8->n + 0x12);
    puVar14[0x11] = *(undefined1 *)((long)psVar8->n + 0x11);
    puVar14[0x12] = (char)psVar8->n[2];
    puVar14[0x13] = (char)(psVar8->n[1] >> 0x2c);
    puVar14[0x14] = (char)(psVar8->n[1] >> 0x24);
    puVar14[0x15] = (char)(psVar8->n[1] >> 0x1c);
    puVar14[0x16] = (char)((uint)psVar8->n[1] >> 0x14);
    puVar14[0x17] = (char)((uint)psVar8->n[1] >> 0xc);
    puVar14[0x18] = (char)((uint)psVar8->n[1] >> 4);
    puVar14[0x19] =
         (byte)((int)psVar8->n[1] << 4) | (byte)*(undefined2 *)((long)psVar8->n + 6) & 0xf;
    puVar14[0x1a] = *(undefined1 *)((long)psVar8->n + 5);
    puVar14[0x1b] = *(undefined1 *)((long)psVar8->n + 4);
    puVar14[0x1c] = *(undefined1 *)((long)psVar8->n + 3);
    puVar14[0x1d] = *(undefined1 *)((long)psVar8->n + 2);
    puVar14[0x1e] = *(undefined1 *)((long)psVar8->n + 1);
    puVar14[0x1f] = (char)psVar8->n[0];
    return;
  }
  psStack_ed0 = (secp256k1_gej *)secp256k1_xonly_pubkey_parse;
  secp256k1_fe_get_b32_cold_1();
  puStack_ee0 = puVar14;
  psStack_ed8 = psVar8;
  psStack_ed0 = psVar10;
  if (psVar15 == (secp256k1_fe *)0x0) {
    secp256k1_xonly_pubkey_parse_cold_3();
  }
  else if (buf != (secp256k1_fe *)0x0) {
    buf[1].n[0] = 0;
    buf[1].n[1] = 0;
    buf->n[4] = 0;
    buf->magnitude = 0;
    buf->normalized = 0;
    buf->n[2] = 0;
    buf->n[3] = 0;
    buf->n[0] = 0;
    buf->n[1] = 0;
    if (a_01 == (uchar *)0x0) {
      secp256k1_xonly_pubkey_parse_cold_1();
      return;
    }
    secp256k1_fe_impl_set_b32_mod(&sStack_f78,a_01);
    if (0xffffefffffc2e < sStack_f78.n[0] &&
        ((sStack_f78.n[2] & sStack_f78.n[3] & sStack_f78.n[1]) == 0xfffffffffffff &&
        sStack_f78.n[4] == 0xffffffffffff)) {
      return;
    }
    sStack_f78.magnitude = 1;
    sStack_f78.normalized = 1;
    secp256k1_fe_verify(&sStack_f78);
    iVar4 = secp256k1_ge_set_xo_var(&sStack_f48,&sStack_f78,0);
    if (iVar4 == 0) {
      return;
    }
    secp256k1_ge_verify(&sStack_f48);
    secp256k1_ge_to_bytes((uchar *)buf,&sStack_f48);
    return;
  }
  secp256k1_xonly_pubkey_parse_cold_2();
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}